

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtCompoundLeafCallback::ProcessChildShape
          (cbtCompoundLeafCallback *this,cbtCollisionShape *childShape,int index)

{
  float fVar1;
  cbtCollisionShape *pcVar2;
  cbtTransform *pcVar3;
  cbtManifoldResult *pcVar4;
  bool bVar5;
  int iVar6;
  cbtCollisionObjectWrapper *pcVar7;
  long lVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lStack_140;
  cbtCollisionObjectWrapper compoundWrap;
  cbtVector3 local_f8;
  cbtVector3 local_e8;
  cbtVector3 aabbMax1;
  cbtVector3 aabbMin1;
  cbtTransform newChildWorldTrans;
  cbtTransform orgTrans;
  cbtCollisionAlgorithm *pcVar9;
  
  pcVar7 = this->m_compoundColObjWrap;
  pcVar2 = pcVar7->m_shape;
  if (gCompoundChildShapePairCallback != (cbtShapePairCallback)0x0) {
    bVar5 = (*gCompoundChildShapePairCallback)(this->m_otherObjWrap->m_shape,childShape);
    if (!bVar5) {
      return;
    }
    pcVar7 = this->m_compoundColObjWrap;
  }
  pcVar3 = pcVar7->m_worldTransform;
  orgTrans.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(pcVar3->m_basis).m_el[0].m_floats;
  orgTrans.m_basis.m_el[0].m_floats._8_8_ = *(undefined8 *)((pcVar3->m_basis).m_el[0].m_floats + 2);
  orgTrans.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(pcVar3->m_basis).m_el[1].m_floats;
  orgTrans.m_basis.m_el[1].m_floats._8_8_ = *(undefined8 *)((pcVar3->m_basis).m_el[1].m_floats + 2);
  orgTrans.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(pcVar3->m_basis).m_el[2].m_floats;
  orgTrans.m_basis.m_el[2].m_floats._8_8_ = *(undefined8 *)((pcVar3->m_basis).m_el[2].m_floats + 2);
  orgTrans.m_origin.m_floats._0_8_ = *(undefined8 *)(pcVar3->m_origin).m_floats;
  orgTrans.m_origin.m_floats._8_8_ = *(undefined8 *)((pcVar3->m_origin).m_floats + 2);
  lVar8 = (long)index;
  cbtTransform::operator*
            (&newChildWorldTrans,&orgTrans,
             (cbtTransform *)(lVar8 * 0x58 + (long)pcVar2[1].m_userPointer));
  (*childShape->_vptr_cbtCollisionShape[2])(childShape,&newChildWorldTrans,&local_e8,&local_f8);
  auVar10._8_8_ = 0;
  auVar10._0_4_ = local_e8.m_floats[0];
  auVar10._4_4_ = local_e8.m_floats[1];
  fVar1 = this->m_resultOut->m_closestPointDistanceThreshold;
  auVar12._4_4_ = fVar1;
  auVar12._0_4_ = fVar1;
  auVar12._8_4_ = fVar1;
  auVar12._12_4_ = fVar1;
  auVar10 = vsubps_avx(auVar10,auVar12);
  local_e8.m_floats._0_8_ = vmovlps_avx(auVar10);
  local_e8.m_floats[2] = local_e8.m_floats[2] - fVar1;
  auVar11._0_4_ = fVar1 + local_f8.m_floats[0];
  auVar11._4_4_ = fVar1 + local_f8.m_floats[1];
  auVar11._8_4_ = fVar1 + 0.0;
  auVar11._12_4_ = fVar1 + 0.0;
  local_f8.m_floats._0_8_ = vmovlps_avx(auVar11);
  local_f8.m_floats[2] = fVar1 + local_f8.m_floats[2];
  pcVar2 = this->m_otherObjWrap->m_shape;
  (*pcVar2->_vptr_cbtCollisionShape[2])
            (pcVar2,this->m_otherObjWrap->m_worldTransform,&aabbMin1,&aabbMax1);
  bVar5 = TestAabbAgainstAabb2(&local_e8,&local_f8,&aabbMin1,&aabbMax1);
  if (bVar5) {
    compoundWrap.m_parent = this->m_compoundColObjWrap;
    compoundWrap.m_collisionObject = (compoundWrap.m_parent)->m_collisionObject;
    compoundWrap.m_worldTransform = &newChildWorldTrans;
    compoundWrap.m_partId = -1;
    fVar1 = this->m_resultOut->m_closestPointDistanceThreshold;
    compoundWrap.m_shape = childShape;
    compoundWrap.m_index = index;
    if (fVar1 <= 0.0) {
      pcVar9 = this->m_childCollisionAlgorithms[lVar8];
      if (pcVar9 == (cbtCollisionAlgorithm *)0x0) {
        iVar6 = (*this->m_dispatcher->_vptr_cbtDispatcher[2])
                          (this->m_dispatcher,&compoundWrap,this->m_otherObjWrap,
                           this->m_sharedManifold,1);
        this->m_childCollisionAlgorithms[lVar8] =
             (cbtCollisionAlgorithm *)CONCAT44(extraout_var_00,iVar6);
        pcVar9 = this->m_childCollisionAlgorithms[lVar8];
      }
    }
    else {
      iVar6 = (*this->m_dispatcher->_vptr_cbtDispatcher[2])
                        (this->m_dispatcher,&compoundWrap,this->m_otherObjWrap,0,2);
      pcVar9 = (cbtCollisionAlgorithm *)CONCAT44(extraout_var,iVar6);
    }
    pcVar4 = this->m_resultOut;
    pcVar7 = pcVar4->m_body0Wrap;
    if (pcVar7->m_collisionObject == this->m_compoundColObjWrap->m_collisionObject) {
      lStack_140 = 0x10;
    }
    else {
      pcVar7 = pcVar4->m_body1Wrap;
      lStack_140 = 0x18;
    }
    *(cbtCollisionObjectWrapper **)((long)&(pcVar4->super_Result)._vptr_Result + lStack_140) =
         &compoundWrap;
    (**(code **)((long)(pcVar4->super_Result)._vptr_Result + lStack_140))
              (pcVar4,0xffffffffffffffff,index);
    (*pcVar9->_vptr_cbtCollisionAlgorithm[2])
              (pcVar9,&compoundWrap,this->m_otherObjWrap,this->m_dispatchInfo,this->m_resultOut);
    (&this->m_resultOut->m_body0Wrap)
    [this->m_resultOut->m_body0Wrap->m_collisionObject !=
     this->m_compoundColObjWrap->m_collisionObject] = pcVar7;
    if (0.0 < fVar1) {
      (**pcVar9->_vptr_cbtCollisionAlgorithm)(pcVar9);
      (*this->m_dispatcher->_vptr_cbtDispatcher[0xf])(this->m_dispatcher,pcVar9);
    }
  }
  return;
}

Assistant:

void ProcessChildShape(const cbtCollisionShape* childShape, int index)
	{
		cbtAssert(index >= 0);
		const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(m_compoundColObjWrap->getCollisionShape());
		cbtAssert(index < compoundShape->getNumChildShapes());

		if (gCompoundChildShapePairCallback)
		{
			if (!gCompoundChildShapePairCallback(m_otherObjWrap->getCollisionShape(), childShape))
				return;
		}

		//backup
		cbtTransform orgTrans = m_compoundColObjWrap->getWorldTransform();

		const cbtTransform& childTrans = compoundShape->getChildTransform(index);
		cbtTransform newChildWorldTrans = orgTrans * childTrans;

		//perform an AABB check first
		cbtVector3 aabbMin0, aabbMax0;
		childShape->getAabb(newChildWorldTrans, aabbMin0, aabbMax0);

		cbtVector3 extendAabb(m_resultOut->m_closestPointDistanceThreshold, m_resultOut->m_closestPointDistanceThreshold, m_resultOut->m_closestPointDistanceThreshold);
		aabbMin0 -= extendAabb;
		aabbMax0 += extendAabb;

		cbtVector3 aabbMin1, aabbMax1;
		m_otherObjWrap->getCollisionShape()->getAabb(m_otherObjWrap->getWorldTransform(), aabbMin1, aabbMax1);


		if (TestAabbAgainstAabb2(aabbMin0, aabbMax0, aabbMin1, aabbMax1))
		{
			cbtCollisionObjectWrapper compoundWrap(this->m_compoundColObjWrap, childShape, m_compoundColObjWrap->getCollisionObject(), newChildWorldTrans, -1, index);

			cbtCollisionAlgorithm* algo = 0;
			bool allocatedAlgorithm = false;

			if (m_resultOut->m_closestPointDistanceThreshold > 0)
			{
				algo = m_dispatcher->findAlgorithm(&compoundWrap, m_otherObjWrap, 0, BT_CLOSEST_POINT_ALGORITHMS);
				allocatedAlgorithm = true;
			}
			else
			{
				//the contactpoint is still projected back using the original inverted worldtrans
				if (!m_childCollisionAlgorithms[index])
				{
					m_childCollisionAlgorithms[index] = m_dispatcher->findAlgorithm(&compoundWrap, m_otherObjWrap, m_sharedManifold, BT_CONTACT_POINT_ALGORITHMS);
				}
				algo = m_childCollisionAlgorithms[index];
			}

			const cbtCollisionObjectWrapper* tmpWrap = 0;

			///detect swapping case
			if (m_resultOut->getBody0Internal() == m_compoundColObjWrap->getCollisionObject())
			{
				tmpWrap = m_resultOut->getBody0Wrap();
				m_resultOut->setBody0Wrap(&compoundWrap);
				m_resultOut->setShapeIdentifiersA(-1, index);
			}
			else
			{
				tmpWrap = m_resultOut->getBody1Wrap();
				m_resultOut->setBody1Wrap(&compoundWrap);
				m_resultOut->setShapeIdentifiersB(-1, index);
			}

			algo->processCollision(&compoundWrap, m_otherObjWrap, m_dispatchInfo, m_resultOut);

#if 0
			if (m_dispatchInfo.m_debugDraw && (m_dispatchInfo.m_debugDraw->getDebugMode() & cbtIDebugDraw::DBG_DrawAabb))
			{
				cbtVector3 worldAabbMin,worldAabbMax;
				m_dispatchInfo.m_debugDraw->drawAabb(aabbMin0,aabbMax0,cbtVector3(1,1,1));
				m_dispatchInfo.m_debugDraw->drawAabb(aabbMin1,aabbMax1,cbtVector3(1,1,1));
			}
#endif

			if (m_resultOut->getBody0Internal() == m_compoundColObjWrap->getCollisionObject())
			{
				m_resultOut->setBody0Wrap(tmpWrap);
			}
			else
			{
				m_resultOut->setBody1Wrap(tmpWrap);
			}
			if (allocatedAlgorithm)
			{
				algo->~cbtCollisionAlgorithm();
				m_dispatcher->freeCollisionAlgorithm(algo);
			}
		}
	}